

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resample.c
# Opt level: O2

void speex_resampler_destroy(SpeexResamplerState *st)

{
  free(st->mem);
  free(st->sinc_table);
  free(st->last_sample);
  free(st->magic_samples);
  free(st->samp_frac_num);
  free(st);
  return;
}

Assistant:

EXPORT void speex_resampler_destroy(SpeexResamplerState *st)
{
   speex_free(st->mem);
   speex_free(st->sinc_table);
   speex_free(st->last_sample);
   speex_free(st->magic_samples);
   speex_free(st->samp_frac_num);
   speex_free(st);
}